

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_bench.cc
# Opt level: O2

void randomize_size_classes(void)

{
  ulong uVar1;
  
  randomize_one_size_class(8);
  for (uVar1 = 0x10; uVar1 < 0x100; uVar1 = uVar1 + 0x10) {
    randomize_one_size_class(uVar1);
  }
  for (uVar1 = 0x100; uVar1 < 0x200; uVar1 = uVar1 + 0x20) {
    randomize_one_size_class(uVar1);
  }
  for (uVar1 = 0x200; uVar1 < 0x400; uVar1 = uVar1 + 0x40) {
    randomize_one_size_class(uVar1);
  }
  for (uVar1 = 0x400; uVar1 < 0x1000; uVar1 = uVar1 + 0x80) {
    randomize_one_size_class(uVar1);
  }
  for (uVar1 = 0x1000; uVar1 < 0x8000; uVar1 = uVar1 + 0x400) {
    randomize_one_size_class(uVar1);
  }
  return;
}

Assistant:

void randomize_size_classes() {
  randomize_one_size_class(8);
  int i;
  for (i = 16; i < 256; i += 16) {
    randomize_one_size_class(i);
  }
  for (; i < 512; i += 32) {
    randomize_one_size_class(i);
  }
  for (; i < 1024; i += 64) {
    randomize_one_size_class(i);
  }
  for (; i < (4 << 10); i += 128) {
    randomize_one_size_class(i);
  }
  for (; i < (32 << 10); i += 1024) {
    randomize_one_size_class(i);
  }
}